

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_shar.c
# Opt level: O0

int archive_write_set_format_shar(archive *_a)

{
  long lVar1;
  int iVar2;
  void *pvVar3;
  int magic_test;
  shar *shar;
  archive_write *a;
  archive *_a_local;
  
  iVar2 = __archive_check_magic(_a,0xb0c5c0de,1,"archive_write_set_format_shar");
  if (iVar2 == -0x1e) {
    _a_local._4_4_ = -0x1e;
  }
  else {
    lVar1._0_4_ = _a[2].magic;
    lVar1._4_4_ = _a[2].state;
    if (lVar1 != 0) {
      (**(code **)(_a + 2))(_a);
    }
    pvVar3 = calloc(1,0x90);
    if (pvVar3 == (void *)0x0) {
      archive_set_error(_a,0xc,"Can\'t allocate shar data");
      _a_local._4_4_ = -0x1e;
    }
    else {
      *(undefined8 *)((long)pvVar3 + 0x60) = 0;
      *(undefined8 *)((long)pvVar3 + 0x68) = 0;
      *(undefined8 *)((long)pvVar3 + 0x70) = 0;
      *(undefined8 *)((long)pvVar3 + 0x78) = 0;
      *(undefined8 *)((long)pvVar3 + 0x80) = 0;
      *(undefined8 *)((long)pvVar3 + 0x88) = 0;
      *(void **)&_a[1].current_codepage = pvVar3;
      _a[1].sconv = (archive_string_conv *)0x26f83c;
      _a[1].read_data_remaining = (size_t)archive_write_shar_header;
      _a[1].read_data_requested = (size_t)archive_write_shar_close;
      *(code **)(_a + 2) = archive_write_shar_free;
      *(code **)&_a[1].read_data_is_posix_read = archive_write_shar_data_sed;
      _a[1].read_data_output_offset = (int64_t)archive_write_shar_finish_entry;
      _a->archive_format = 0x20001;
      _a->archive_format_name = "shar";
      _a_local._4_4_ = 0;
    }
  }
  return _a_local._4_4_;
}

Assistant:

int
archive_write_set_format_shar(struct archive *_a)
{
	struct archive_write *a = (struct archive_write *)_a;
	struct shar *shar;

	archive_check_magic(_a, ARCHIVE_WRITE_MAGIC,
	    ARCHIVE_STATE_NEW, "archive_write_set_format_shar");

	/* If someone else was already registered, unregister them. */
	if (a->format_free != NULL)
		(a->format_free)(a);

	shar = (struct shar *)calloc(1, sizeof(*shar));
	if (shar == NULL) {
		archive_set_error(&a->archive, ENOMEM, "Can't allocate shar data");
		return (ARCHIVE_FATAL);
	}
	archive_string_init(&shar->work);
	archive_string_init(&shar->quoted_name);
	a->format_data = shar;
	a->format_name = "shar";
	a->format_write_header = archive_write_shar_header;
	a->format_close = archive_write_shar_close;
	a->format_free = archive_write_shar_free;
	a->format_write_data = archive_write_shar_data_sed;
	a->format_finish_entry = archive_write_shar_finish_entry;
	a->archive.archive_format = ARCHIVE_FORMAT_SHAR_BASE;
	a->archive.archive_format_name = "shar";
	return (ARCHIVE_OK);
}